

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_teleport_tree.hpp
# Opt level: O0

WorldTeleportTree * WorldTeleportTree::from_json(Json *json)

{
  undefined8 uVar1;
  uchar uVar2;
  unsigned_short uVar3;
  const_reference pvVar4;
  ostream *poVar5;
  WorldTeleportTree *this;
  Flag local_398;
  string local_388;
  string local_368;
  allocator<char> local_341;
  key_type local_340;
  allocator<char> local_319;
  key_type local_318;
  uchar local_2f1;
  undefined1 local_2f0 [7];
  uint8_t bit;
  stringstream local_2d0 [8];
  stringstream ss;
  ostream local_2c0 [383];
  allocator<char> local_141;
  key_type local_140;
  allocator<char> local_119;
  key_type local_118;
  undefined1 local_f8 [8];
  string byte_string;
  undefined1 local_d0 [4];
  uint16_t byte;
  undefined1 local_b0 [8];
  string node_id;
  key_type local_88;
  unsigned_short local_66;
  uint16_t tree_map_id;
  allocator<char> local_51;
  key_type local_50;
  undefined1 local_30 [8];
  string name;
  Json *json_local;
  
  name.field_2._8_8_ = json;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"name",&local_51);
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_50);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::
  operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,pvVar4);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  uVar1 = name.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"treeMapId",(allocator<char> *)(node_id.field_2._M_local_buf + 0xf)
            );
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)uVar1,&local_88);
  uVar3 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator_unsigned_short<unsigned_short,_0>(pvVar4);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)(node_id.field_2._M_local_buf + 0xf));
  uVar1 = name.field_2._8_8_;
  local_66 = uVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d0,"nodeId",(allocator<char> *)(byte_string.field_2._M_local_buf + 0xf)
            );
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)uVar1,(key_type *)local_d0);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::
  operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,pvVar4);
  std::__cxx11::string::~string((string *)local_d0);
  std::allocator<char>::~allocator((allocator<char> *)(byte_string.field_2._M_local_buf + 0xf));
  uVar1 = name.field_2._8_8_;
  byte_string.field_2._12_2_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"flag",&local_119);
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)uVar1,&local_118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"byte",&local_141);
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(pvVar4,&local_140);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::
  operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,pvVar4);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  std::__cxx11::stringstream::stringstream(local_2d0);
  poVar5 = (ostream *)std::ostream::operator<<(local_2c0,std::hex);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,2,
             0xffffffffffffffff);
  std::operator<<(poVar5,(string *)local_2f0);
  std::__cxx11::string::~string((string *)local_2f0);
  std::istream::operator>>(local_2d0,(ushort *)(byte_string.field_2._M_local_buf + 0xc));
  uVar1 = name.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"flag",&local_319);
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)uVar1,&local_318);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"bit",&local_341);
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(pvVar4,&local_340);
  uVar2 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator_unsigned_char<unsigned_char,_0>(pvVar4);
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator(&local_341);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator(&local_319);
  local_2f1 = uVar2;
  this = (WorldTeleportTree *)operator_new(0x58);
  std::__cxx11::string::string
            ((string *)&local_368,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  uVar3 = local_66;
  std::__cxx11::string::string
            ((string *)&local_388,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
  Flag::Flag(&local_398,byte_string.field_2._12_2_,local_2f1);
  WorldTeleportTree(this,&local_368,uVar3,&local_388,&local_398);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::stringstream::~stringstream(local_2d0);
  std::__cxx11::string::~string((string *)local_f8);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)local_30);
  return this;
}

Assistant:

static WorldTeleportTree* from_json(const Json& json)
    {
        std::string name = json.at("name");
        uint16_t tree_map_id = json.at("treeMapId");
        std::string node_id = json.at("nodeId");

        uint16_t byte = 0;
        std::string byte_string = json.at("flag").at("byte");
        std::stringstream ss;
        ss << std::hex << byte_string.substr(2);
        ss >> byte;
        uint8_t bit = json.at("flag").at("bit");

        return new WorldTeleportTree(name, tree_map_id, node_id, Flag(byte, bit));
    }